

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool __thiscall
TimesAll<0,0,0>::propagate_xy_max<0,0>
          (TimesAll<0,0,0> *this,IntView<0> u,IntView<0> v,int64_t v_min,int64_t v_max,int64_t z_min
          ,int64_t z_max)

{
  uint uVar1;
  int iVar2;
  Clause *in_RAX;
  IntVar *pIVar3;
  ulong uVar4;
  Clause *pCVar5;
  IntVar *pIVar6;
  Clause *pCVar7;
  ulong uVar8;
  Clause *c;
  Clause *local_38;
  
  pIVar3 = v.var;
  pIVar6 = u.var;
  if (v_max < 1 || -1 < v_min) {
    if (v_max < 0) {
      z_max = z_min;
    }
    if (z_min < 1) {
      v_min = v_max;
    }
    uVar8 = z_max / v_min;
  }
  else {
    uVar4 = -z_min;
    if (0 < z_min) {
      uVar4 = z_min;
    }
    if ((long)uVar4 <= z_max) {
      uVar4 = z_max;
    }
    uVar8 = -z_max;
    if (uVar4 != uVar8 && SBORROW8(uVar4,uVar8) == (long)(uVar4 + z_max) < 0) {
      uVar8 = uVar4;
    }
  }
  pCVar5 = (Clause *)0x1;
  if ((long)uVar8 < (long)(pIVar6->max).v) {
    if (so.lazy) {
      local_38 = (Clause *)malloc(0x1c);
      *(uint *)local_38 = *(uint *)local_38 & 0xfc | 0x502;
      vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
      pCVar7 = local_38;
      uVar1 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[8])(pIVar3);
      if (*(uint *)pCVar7 < 0x200) {
LAB_001b0382:
        abort();
      }
      *(uint *)(pCVar7 + 1) = uVar1;
      iVar2 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[9])(pIVar3);
      if (*(uint *)pCVar7 < 0x300) goto LAB_001b0382;
      pCVar7[1].data[0].x = iVar2;
      uVar1 = (**(code **)(**(long **)(this + 0x38) + 0x40))();
      if (*(uint *)pCVar7 < 0x400) goto LAB_001b0382;
      *(uint *)(pCVar7 + 2) = uVar1;
      iVar2 = (**(code **)(**(long **)(this + 0x38) + 0x48))();
      if (*(uint *)pCVar7 < 0x500) goto LAB_001b0382;
      pCVar7[2].data[0].x = iVar2;
    }
    else {
      pCVar7 = (Clause *)0x0;
      local_38 = in_RAX;
    }
    uVar8 = -(ulong)(uVar8 == 0) | uVar8;
    if ((long)uVar8 < (long)(pIVar6->max).v) {
      pCVar5 = (Clause *)0x0;
      if (so.lazy == false) {
        pCVar7 = pCVar5;
      }
      iVar2 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[0xf])(pIVar6,uVar8,pCVar7,1);
      if ((char)iVar2 == '\0') goto LAB_001b0371;
    }
    pCVar5 = (Clause *)0x1;
  }
LAB_001b0371:
  return SUB81(pCVar5,0);
}

Assistant:

bool propagate_xy_max(IntView<U> u, IntView<V> v, const int64_t v_min, const int64_t v_max,
												const int64_t z_min, const int64_t z_max) {
		assert(z_min > 0 || z_max < 0);
		assert(v_min != 0 && v_max != 0);
		// The product z cannot be 0. Then x and y cannot be 0, too.
		// u <= floor(z / v)
		int64_t u_max_new = 0;
		if (v_min < 0 && v_max > 0) {
			// The domain of integer variable v contains -1 and 1
			u_max_new = std::max(-1 * z_min, z_min);
			u_max_new = std::max(u_max_new, z_max);
			u_max_new = std::max(u_max_new, -1 * z_max);
		} else {
			u_max_new = (v_max < 0 ? z_min : z_max) / (z_min > 0 ? v_min : v_max);
		}

		if (u_max_new < u.getMax()) {
			// TODO Better explanation
			Clause* reason = nullptr;
			if (so.lazy) {
				reason = Reason_new(5);
				(*reason)[1] = v.getMinLit();
				(*reason)[2] = v.getMaxLit();
				(*reason)[3] = z.getMinLit();
				(*reason)[4] = z.getMaxLit();
			}
			setDom(u, setMax, (u_max_new == 0 ? -1 : u_max_new), reason);
		}

		return true;
	}